

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_Constructor_type_prefix_Test::TestBody
          (AddressFactory_Constructor_type_prefix_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_4d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  AssertionResult gtest_ar;
  AddressFactory factory_3;
  Pubkey pubkey;
  AddressFactory factory;
  Pubkey local_2f8 [15];
  Pubkey local_180 [15];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory(&factory,kMainnet,(vector *)&factory_3);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_3);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa7,
               "Expected: AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_3,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory(&factory,kTestnet,(vector *)&factory_3);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_3);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa8,
               "Expected: AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_3,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory(&factory,kRegtest,(vector *)&factory_3);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_3);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa9,
               "Expected: AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_3,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  std::__cxx11::string::string
            ((string *)&factory,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af"
             ,(allocator *)&factory_3);
  cfd::core::Pubkey::Pubkey(&pubkey,(string *)&factory);
  std::__cxx11::string::~string((string *)&factory);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&factory_3,kMainnet,(vector *)&factory);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)&factory);
  local_4c8.ptr_._0_4_ = factory._vptr_AddressFactory._0_4_;
  local_4d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kMainnet",(NetType *)&local_4c8,
             (NetType *)&local_4d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_4c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_4c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_4c8.ptr_._0_4_ = factory.type_;
  local_4d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_4c8,(WitnessVersion *)&local_4d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_4c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_4c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_3);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&factory_3,kTestnet,(vector *)&factory);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  cfd::AddressFactory::CreateP2wpkhAddress((Pubkey *)&factory);
  local_4c8.ptr_._0_4_ = factory._vptr_AddressFactory._0_4_;
  local_4d0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kTestnet",(NetType *)&local_4c8,
             (NetType *)&local_4d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_4c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_4c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_4c8.ptr_._0_4_ = factory.type_;
  local_4d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersion0",
             (WitnessVersion *)&local_4c8,(WitnessVersion *)&local_4d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_4c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_4c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_3);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&factory_3,kRegtest,(vector *)&factory);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)&factory);
  local_4c8.ptr_._0_4_ = factory._vptr_AddressFactory._0_4_;
  local_4d0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kRegtest",(NetType *)&local_4c8,
             (NetType *)&local_4d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_4c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_4c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_4c8.ptr_._0_4_ = factory.type_;
  local_4d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_4c8,(WitnessVersion *)&local_4d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_4c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_4c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_3);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&factory,kLiquidV1,(vector *)&factory_3);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_3);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(local_180);
    cfd::core::Address::~Address((Address *)local_180);
  }
  testing::Message::Message((Message *)&factory_3);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xc2,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_3);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_3);
  cfd::AddressFactory::~AddressFactory(&factory);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&factory,kElementsRegtest,(vector *)&factory_3);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_3);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(local_2f8);
    cfd::core::Address::~Address((Address *)local_2f8);
  }
  testing::Message::Message((Message *)&factory_3);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xc6,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_3);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_3);
  cfd::AddressFactory::~AddressFactory(&factory);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    AddressFactory factory(NetType::kLiquidV1, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}